

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

void __thiscall Mat::reoeder(Mat *this)

{
  size_type *psVar1;
  __normal_iterator<__int128_*,_std::vector<__int128,_std::allocator<__int128>_>_> in_RDI;
  int j;
  int i;
  int tmp_c;
  int tmp_r;
  vector<__int128,_std::allocator<__int128>_> v;
  vector<__int128,_std::allocator<__int128>_> *in_stack_ffffffffffffff68;
  allocator_type *in_stack_ffffffffffffff80;
  __normal_iterator<__int128_*,_std::vector<__int128,_std::allocator<__int128>_>_>
  in_stack_ffffffffffffff88;
  int local_44;
  int local_40;
  int local_3c;
  int local_38 [6];
  vector<__int128,_std::allocator<__int128>_> local_20;
  
  std::allocator<__int128>::allocator((allocator<__int128> *)0x10f04a);
  std::vector<__int128,_std::allocator<__int128>_>::vector
            ((vector<__int128,_std::allocator<__int128>_> *)in_RDI._M_current,
             (size_type)in_stack_ffffffffffffff88._M_current,in_stack_ffffffffffffff80);
  std::allocator<__int128>::~allocator((allocator<__int128> *)0x10f06a);
  local_38[0] = *(int *)&(((vector<__int128,_std::allocator<__int128>_> *)in_RDI._M_current)->
                         super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                         super__Vector_impl_data._M_start;
  local_3c = *(int *)((long)&(((vector<__int128,_std::allocator<__int128>_> *)in_RDI._M_current)->
                             super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                             super__Vector_impl_data._M_start + 4);
  if (*(int *)&(((vector<__int128,_std::allocator<__int128>_> *)in_RDI._M_current)->
               super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
               super__Vector_impl_data._M_finish == 1) {
    std::swap<int>(local_38,&local_3c);
  }
  for (local_40 = 0; local_40 < local_38[0]; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < local_3c; local_44 = local_44 + 1) {
      psVar1 = (size_type *)
               std::vector<__int128,_std::allocator<__int128>_>::operator[]
                         ((vector<__int128,_std::allocator<__int128>_> *)
                          &(((vector<__int128,_std::allocator<__int128>_> *)in_RDI._M_current)->
                           super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                          (long)(local_44 * local_38[0] + local_40));
      in_stack_ffffffffffffff88._M_current = (__int128 *)*psVar1;
      in_stack_ffffffffffffff80 = (allocator_type *)psVar1[1];
      psVar1 = (size_type *)
               std::vector<__int128,_std::allocator<__int128>_>::operator[]
                         (&local_20,(long)(local_40 * local_3c + local_44));
      psVar1[1] = (size_type)in_stack_ffffffffffffff80;
      *psVar1 = (size_type)in_stack_ffffffffffffff88._M_current;
    }
  }
  std::vector<__int128,_std::allocator<__int128>_>::begin(in_stack_ffffffffffffff68);
  std::vector<__int128,_std::allocator<__int128>_>::end(in_stack_ffffffffffffff68);
  std::vector<__int128,std::allocator<__int128>>::
  assign<__gnu_cxx::__normal_iterator<__int128*,std::vector<__int128,std::allocator<__int128>>>,void>
            ((vector<__int128,_std::allocator<__int128>_> *)in_stack_ffffffffffffff80,in_RDI,
             in_stack_ffffffffffffff88);
  *(uint *)((long)in_RDI._M_current + 8) = *(uint *)((long)in_RDI._M_current + 8) ^ 1;
  std::vector<__int128,_std::allocator<__int128>_>::~vector
            ((vector<__int128,_std::allocator<__int128>_> *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

void Mat::reoeder() {
    vector<ll128> v(r * c);
    int tmp_r = r;
    int tmp_c = c;
    if (order == MatRowMajor) {
        swap(tmp_r, tmp_c);
    }
    for (int i = 0; i < tmp_r; i++) {
        for (int j = 0; j < tmp_c; j++) {
            v[i * tmp_c + j] = val[j * tmp_r + i];
        }
    }
    val.assign(v.begin(), v.end());
    order ^= 1;
}